

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_55a4::FloatxNanInfTest_DIV_3_3_simple_Test::~FloatxNanInfTest_DIV_3_3_simple_Test
          (FloatxNanInfTest_DIV_3_3_simple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_3_3_simple)
{
    using T = flexfloat<3, 3>;
    T a = 0.33333333333333331483;
    T b = 0.11111111111111110494;
    T c = 0;
    c = a / b;
    EXPECT_EQ(fp_t(a), 3.43750000000000000000e-01);
    EXPECT_EQ(fp_t(b), 1.25000000000000000000e-01);
    EXPECT_EQ(fp_t(c), 2.7500000000000000000e-00);
}